

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

void __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
          (Roaring64MapSetBitBiDirectionalIterator *this,Roaring64Map *parent,bool exhausted)

{
  const_iterator *this_00;
  undefined3 in_register_00000011;
  _Base_ptr p_Var1;
  
  this->p = &parent->roarings;
  this_00 = &this->map_iter;
  (this->map_iter)._M_node = (_Base_ptr)0x0;
  (this->i).parent = (roaring_bitmap_t *)0x0;
  *(undefined8 *)((long)&(this->i).parent + 1) = 0;
  *(undefined8 *)((long)&(this->i).container + 1) = 0;
  (this->i).container_index = 0;
  (this->i).highbits = 0;
  (this->i).container_it = 0;
  (this->i).current_value = 0;
  (this->i).has_value = false;
  if ((CONCAT31(in_register_00000011,exhausted) == 0) &&
     ((parent->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var1 = (parent->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    this_00->_M_node = p_Var1;
    do {
      roaring_iterator_init
                ((roaring_bitmap_t *)&p_Var1[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
      if ((this->i).has_value != false) {
        return;
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                (this_00,0);
      p_Var1 = (this->map_iter)._M_node;
    } while ((_Rb_tree_header *)p_Var1 != &(this->p->_M_t)._M_impl.super__Rb_tree_header);
  }
  else {
    this_00->_M_node = &(parent->roarings)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  return;
}

Assistant:

Roaring64MapSetBitBiDirectionalIterator(const Roaring64Map &parent,
                                            bool exhausted = false)
        : p(&parent.roarings) {
        if (exhausted || parent.roarings.empty()) {
            map_iter = p->cend();
        } else {
            map_iter = parent.roarings.cbegin();
            roaring_iterator_init(&map_iter->second.roaring, &i);
            while (!i.has_value) {
                map_iter++;
                if (map_iter == p->cend()) return;
                roaring_iterator_init(&map_iter->second.roaring, &i);
            }
        }
    }